

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseEndLabelOpt(WastParser *this,string *begin_label)

{
  pointer __n;
  Location loc_00;
  undefined8 uVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  Result RVar4;
  int iVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  Enum EVar6;
  _Alloc_hider _Stack_98;
  string end_label;
  Location loc;
  
  GetToken((Token *)&stack0xffffffffffffff68,this);
  _Var3 = end_label._M_dataplus;
  _Var2._M_p = _Stack_98._M_p;
  uVar1 = CONCAT71(end_label._M_string_length._1_7_,(undefined1)end_label._M_string_length);
  Token::~Token((Token *)&stack0xffffffffffffff68);
  end_label._M_dataplus._M_p = (pointer)0x0;
  end_label._M_string_length._0_1_ = 0;
  _Stack_98._M_p = (pointer)&end_label._M_string_length;
  RVar4 = ParseLabelOpt(this,(string *)&stack0xffffffffffffff68);
  EVar6 = Error;
  if (RVar4.enum_ != Error) {
    EVar6 = Ok;
    if (end_label._M_dataplus._M_p != (pointer)0x0) {
      __n = (pointer)begin_label->_M_string_length;
      loc.filename.data_._0_4_ = SUB84(_Var3._M_p,0);
      loc.filename.data_._4_4_ = (undefined4)((ulong)_Var3._M_p >> 0x20);
      loc.filename.size_._0_4_ = (undefined4)uVar1;
      loc.filename.size_._4_4_ = (undefined4)((uint7)end_label._M_string_length._1_7_ >> 0x18);
      loc.field_1.field_0.line = (int)end_label.field_2._M_allocated_capacity;
      loc.field_1.field_0.first_column = (int)((ulong)end_label.field_2._0_8_ >> 0x20);
      if (__n == (pointer)0x0) {
        EVar6 = Ok;
        Error(this,0x11ec35f,_Stack_98._M_p);
      }
      else {
        if (__n == end_label._M_dataplus._M_p) {
          iVar5 = bcmp((begin_label->_M_dataplus)._M_p,_Stack_98._M_p,(size_t)__n);
          EVar6 = Ok;
          if (iVar5 == 0) goto LAB_00f74fd9;
        }
        EVar6 = Ok;
        loc_00.filename.size_._0_4_ = loc.filename.data_._0_4_;
        loc_00.filename.data_ = _Var2._M_p;
        loc_00.filename.size_._4_4_ = loc.filename.data_._4_4_;
        loc_00.field_1.field_0.line = (undefined4)loc.filename.size_;
        loc_00.field_1.field_0.first_column = loc.filename.size_._4_4_;
        loc_00.field_1.field_0.last_column = loc.field_1.field_0.line;
        loc_00.field_1._12_4_ = loc.field_1.field_0.first_column;
        Error(this,loc_00,"mismatching label \"%s\" != \"%s\"",(begin_label->_M_dataplus)._M_p,
              _Stack_98._M_p,in_R8,in_R9);
      }
    }
  }
LAB_00f74fd9:
  if ((size_type *)_Stack_98._M_p != &end_label._M_string_length) {
    operator_delete(_Stack_98._M_p);
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseEndLabelOpt(const std::string& begin_label) {
  WABT_TRACE(ParseEndLabelOpt);
  Location loc = GetLocation();
  std::string end_label;
  CHECK_RESULT(ParseLabelOpt(&end_label));
  if (!end_label.empty()) {
    if (begin_label.empty()) {
      Error(loc, "unexpected label \"%s\"", end_label.c_str());
    } else if (begin_label != end_label) {
      Error(loc, "mismatching label \"%s\" != \"%s\"", begin_label.c_str(),
            end_label.c_str());
    }
  }
  return Result::Ok;
}